

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Bool setContext(XML_Parser parser,XML_Char *context)

{
  STRING_POOL *pool;
  DTD *table;
  XML_Bool XVar1;
  char cVar2;
  XML_Error XVar3;
  NAMED *pNVar4;
  PREFIX *prefix;
  XML_Char *pXVar5;
  char *pcVar6;
  XML_Bool XVar7;
  char *pcVar8;
  
  if (context == (XML_Char *)0x0) {
LAB_0016d05c:
    XVar7 = '\0';
  }
  else {
    XVar7 = '\x01';
    if (*context != '\0') {
      table = parser->m_dtd;
      pool = &parser->m_tempPool;
      pcVar6 = context;
      do {
        cVar2 = *pcVar6;
        if (cVar2 == '\0') {
LAB_0016ce50:
          pXVar5 = (parser->m_tempPool).ptr;
          if (pXVar5 == (parser->m_tempPool).end) {
            XVar1 = poolGrow(pool);
            if (XVar1 == '\0') goto LAB_0016d05c;
            pXVar5 = (parser->m_tempPool).ptr;
          }
          (parser->m_tempPool).ptr = pXVar5 + 1;
          *pXVar5 = '\0';
          pNVar4 = lookup(parser,&table->generalEntities,(parser->m_tempPool).start,0);
          if (pNVar4 != (NAMED *)0x0) {
            *(undefined1 *)&pNVar4[7].name = 1;
          }
          cVar2 = *pcVar6;
          (parser->m_tempPool).ptr = (parser->m_tempPool).start;
          context = pcVar6 + (cVar2 != '\0');
          pcVar6 = pcVar6 + (cVar2 != '\0');
        }
        else if (cVar2 == '=') {
          pXVar5 = (parser->m_tempPool).ptr;
          prefix = &table->defaultPrefix;
          if (pXVar5 != (parser->m_tempPool).start) {
            if (pXVar5 == (parser->m_tempPool).end) {
              XVar1 = poolGrow(pool);
              if (XVar1 == '\0') goto LAB_0016d05c;
              pXVar5 = (parser->m_tempPool).ptr;
            }
            (parser->m_tempPool).ptr = pXVar5 + 1;
            *pXVar5 = '\0';
            prefix = (PREFIX *)lookup(parser,&table->prefixes,(parser->m_tempPool).start,0x10);
            if (prefix == (PREFIX *)0x0) goto LAB_0016d05c;
            pXVar5 = (parser->m_tempPool).start;
            if (prefix->name == pXVar5) {
              pXVar5 = poolCopyString(&table->pool,prefix->name);
              prefix->name = pXVar5;
              if (pXVar5 == (XML_Char *)0x0) goto LAB_0016d05c;
              pXVar5 = (parser->m_tempPool).start;
            }
            (parser->m_tempPool).ptr = pXVar5;
          }
          while( true ) {
            pcVar8 = pcVar6 + 1;
            cVar2 = *pcVar8;
            if ((cVar2 == '\0') || (cVar2 == '\f')) break;
            pcVar6 = (parser->m_tempPool).ptr;
            if (pcVar6 == (parser->m_tempPool).end) {
              XVar1 = poolGrow(pool);
              if (XVar1 == '\0') goto LAB_0016d05c;
              cVar2 = *pcVar8;
              pcVar6 = (parser->m_tempPool).ptr;
            }
            (parser->m_tempPool).ptr = pcVar6 + 1;
            *pcVar6 = cVar2;
            pcVar6 = pcVar8;
          }
          pXVar5 = (parser->m_tempPool).ptr;
          if (pXVar5 == (parser->m_tempPool).end) {
            XVar1 = poolGrow(pool);
            if (XVar1 == '\0') goto LAB_0016d05c;
            pXVar5 = (parser->m_tempPool).ptr;
          }
          (parser->m_tempPool).ptr = pXVar5 + 1;
          *pXVar5 = '\0';
          XVar3 = addBinding(parser,prefix,(ATTRIBUTE_ID *)0x0,(parser->m_tempPool).start,
                             &parser->m_inheritedBindings);
          if (XVar3 != XML_ERROR_NONE) goto LAB_0016d05c;
          (parser->m_tempPool).ptr = (parser->m_tempPool).start;
          context = pcVar6 + 2;
          pcVar6 = pcVar6 + 2;
          if (*pcVar8 == '\0') {
            context = pcVar8;
            pcVar6 = pcVar8;
          }
        }
        else {
          if (cVar2 == '\f') goto LAB_0016ce50;
          pcVar8 = (parser->m_tempPool).ptr;
          if (pcVar8 == (parser->m_tempPool).end) {
            XVar1 = poolGrow(pool);
            if (XVar1 == '\0') goto LAB_0016d05c;
            cVar2 = *pcVar6;
            pcVar8 = (parser->m_tempPool).ptr;
          }
          (parser->m_tempPool).ptr = pcVar8 + 1;
          *pcVar8 = cVar2;
          pcVar6 = pcVar6 + 1;
        }
      } while (*context != '\0');
    }
  }
  return XVar7;
}

Assistant:

static XML_Bool
setContext(XML_Parser parser, const XML_Char *context) {
  if (context == NULL) {
    return XML_FALSE;
  }

  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  const XML_Char *s = context;

  while (*context != XML_T('\0')) {
    if (*s == CONTEXT_SEP || *s == XML_T('\0')) {
      ENTITY *e;
      if (! poolAppendChar(&parser->m_tempPool, XML_T('\0')))
        return XML_FALSE;
      e = (ENTITY *)lookup(parser, &dtd->generalEntities,
                           poolStart(&parser->m_tempPool), 0);
      if (e)
        e->open = XML_TRUE;
      if (*s != XML_T('\0'))
        s++;
      context = s;
      poolDiscard(&parser->m_tempPool);
    } else if (*s == XML_T(ASCII_EQUALS)) {
      PREFIX *prefix;
      if (poolLength(&parser->m_tempPool) == 0)
        prefix = &dtd->defaultPrefix;
      else {
        if (! poolAppendChar(&parser->m_tempPool, XML_T('\0')))
          return XML_FALSE;
        prefix
            = (PREFIX *)lookup(parser, &dtd->prefixes,
                               poolStart(&parser->m_tempPool), sizeof(PREFIX));
        if (! prefix)
          return XML_FALSE;
        if (prefix->name == poolStart(&parser->m_tempPool)) {
          prefix->name = poolCopyString(&dtd->pool, prefix->name);
          if (! prefix->name)
            return XML_FALSE;
        }
        poolDiscard(&parser->m_tempPool);
      }
      for (context = s + 1; *context != CONTEXT_SEP && *context != XML_T('\0');
           context++)
        if (! poolAppendChar(&parser->m_tempPool, *context))
          return XML_FALSE;
      if (! poolAppendChar(&parser->m_tempPool, XML_T('\0')))
        return XML_FALSE;
      if (addBinding(parser, prefix, NULL, poolStart(&parser->m_tempPool),
                     &parser->m_inheritedBindings)
          != XML_ERROR_NONE)
        return XML_FALSE;
      poolDiscard(&parser->m_tempPool);
      if (*context != XML_T('\0'))
        ++context;
      s = context;
    } else {
      if (! poolAppendChar(&parser->m_tempPool, *s))
        return XML_FALSE;
      s++;
    }
  }
  return XML_TRUE;
}